

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  bool bVar1;
  ostream *poVar2;
  string local_40;
  
  bVar1 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar1) {
    local_40._M_dataplus._M_p._0_1_ = 0x20;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(this->document_,(char *)&local_40,1)
    ;
    Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                       local_40._M_dataplus._M_p._0_1_),local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
  }
  bVar1 = Value::hasComment(root,commentAfter);
  if (bVar1) {
    writeIndent(this);
    poVar2 = this->document_;
    Value::getComment_abi_cxx11_(&local_40,root,commentAfter);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                       local_40._M_dataplus._M_p._0_1_),local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
  }
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}